

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.h
# Opt level: O2

void __thiscall
hypermind::CompileUnit::EmitCall(CompileUnit *this,HMInteger methodIndex,HMInteger argNum)

{
  uint uVar1;
  
  uVar1 = this->mStackSlotNum - argNum;
  this->mStackSlotNum = uVar1;
  if (this->mFn->maxStackSlotNum < uVar1) {
    this->mFn->maxStackSlotNum = uVar1;
  }
  if (argNum < 8) {
    WriteByte(this,(char)argNum + '\x10');
  }
  else {
    WriteByte(this,'\x0f');
    WriteShortOperand(this,methodIndex);
    methodIndex = argNum;
  }
  WriteShortOperand(this,methodIndex);
  return;
}

Assistant:

void EmitCall(HMInteger methodIndex, HMInteger argNum) {
            STACK_CHANGE(-argNum);
            if (argNum <= 7) {
                WriteByte(static_cast<HMByte>((HMByte) Opcode::Call0 + argNum));
                WriteShortOperand(methodIndex);
            } else {
                WriteOpcode(Opcode::Call);
                WriteShortOperand(methodIndex); // 方法索引
                WriteShortOperand(argNum); // 实参数量
            }
        }